

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# student.h
# Opt level: O0

int __thiscall
CP::map_bst<int,_int,_std::less<int>_>::shallowest_leaf
          (map_bst<int,_int,_std::less<int>_> *this,node *n)

{
  int iVar1;
  int *piVar2;
  int local_28;
  int local_24;
  node *local_20;
  node *n_local;
  map_bst<int,_int,_std::less<int>_> *this_local;
  
  if (n == (node *)0x0) {
    this_local._4_4_ = -1;
  }
  else {
    local_20 = n;
    n_local = (node *)this;
    if ((n->left == (node *)0x0) && (n->right != (node *)0x0)) {
      iVar1 = shallowest_leaf(this,n->right);
      this_local._4_4_ = iVar1 + 1;
    }
    else if ((n->left == (node *)0x0) || (n->right != (node *)0x0)) {
      local_24 = shallowest_leaf(this,n->left);
      local_28 = shallowest_leaf(this,local_20->right);
      piVar2 = std::min<int>(&local_24,&local_28);
      this_local._4_4_ = *piVar2 + 1;
    }
    else {
      iVar1 = shallowest_leaf(this,n->left);
      this_local._4_4_ = iVar1 + 1;
    }
  }
  return this_local._4_4_;
}

Assistant:

int CP::map_bst<KeyT,MappedT,CompareT>::shallowest_leaf(node* n) {
  if (n == nullptr) return -1;
  if (n->left == nullptr && n->right != nullptr) return 1 + shallowest_leaf(n->right);
  if (n->left != nullptr && n->right == nullptr) return 1 + shallowest_leaf(n->left);
  return 1 + std::min(shallowest_leaf(n->left), shallowest_leaf(n->right));
}